

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketAcceptor.cpp
# Opt level: O0

void * FIX::ThreadedSocketAcceptor::socketConnectionThread(void *p)

{
  ThreadedSocketAcceptor *this;
  ThreadedSocketConnection *this_00;
  bool bVar1;
  socket_handle s;
  ulong uVar2;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  undefined8 in_RSI;
  socket_handle socket;
  ThreadedSocketConnection *pConnection;
  ThreadedSocketAcceptor *pAcceptor;
  ConnectionThreadInfo *info;
  void *p_local;
  
  this = *p;
  this_00 = *(ThreadedSocketConnection **)((long)p + 8);
  if (p != (void *)0x0) {
    in_RSI = 0x10;
    operator_delete(p,0x10);
  }
  s = ThreadedSocketConnection::getSocket(this_00);
  __buf = extraout_RDX;
  do {
    uVar2 = ThreadedSocketConnection::read(this_00,(int)in_RSI,__buf,in_RCX);
    __buf = extraout_RDX_00;
  } while ((uVar2 & 1) != 0);
  if (this_00 != (ThreadedSocketConnection *)0x0) {
    (*(this_00->super_Responder)._vptr_Responder[1])();
  }
  bVar1 = Acceptor::isStopped(&this->super_Acceptor);
  if (!bVar1) {
    removeThread(this,s);
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC ThreadedSocketAcceptor::socketConnectionThread(void *p) {
  ConnectionThreadInfo *info = reinterpret_cast<ConnectionThreadInfo *>(p);

  ThreadedSocketAcceptor *pAcceptor = info->m_pAcceptor;
  ThreadedSocketConnection *pConnection = info->m_pConnection;
  delete info;

  socket_handle socket = pConnection->getSocket();

  while (pConnection->read()) {}
  delete pConnection;
  if (!pAcceptor->isStopped()) {
    pAcceptor->removeThread(socket);
  }
  return 0;
}